

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaUtilityTargetGenerator.cxx
# Opt level: O2

void __thiscall cmNinjaUtilityTargetGenerator::Generate(cmNinjaUtilityTargetGenerator *this)

{
  pointer pcVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar4;
  cmGeneratorTarget *this_01;
  pointer ppcVar5;
  bool bVar6;
  TargetType TVar7;
  string *psVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  MapToNinjaPathImpl MVar10;
  long lVar11;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  char *pcVar13;
  cmGlobalNinjaGenerator *pcVar14;
  cmGeneratedFileStream *pcVar15;
  cmCustomCommandGenerator *this_02;
  pointer ppcVar16;
  string *util_output;
  pointer cc_00;
  allocator_type local_2b2;
  allocator<char> local_2b1;
  undefined8 local_2b0;
  string local_2a8;
  string command;
  string desc;
  cmNinjaDeps deps;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  cmCustomCommandGenerator ccg;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  cmNinjaDeps outputs;
  cmNinjaDeps util_outputs;
  cmNinjaDeps local_108;
  long local_f0;
  string config;
  string utilCommandName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdLists [2];
  string local_70;
  string local_50;
  
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
  std::__cxx11::string::string((string *)&utilCommandName,(string *)psVar8);
  std::__cxx11::string::append((char *)&utilCommandName);
  std::__cxx11::string::append((char *)&utilCommandName);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&config,&this->super_cmNinjaTargetGenerator);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ccg,&config,
                 ".util");
  std::__cxx11::string::append((string *)&utilCommandName);
  std::__cxx11::string::~string((string *)&ccg);
  std::__cxx11::string::~string((string *)&config);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            ((string *)&ccg,&this->super_cmNinjaTargetGenerator,&utilCommandName);
  std::__cxx11::string::operator=((string *)&utilCommandName,(string *)&ccg);
  std::__cxx11::string::~string((string *)&ccg);
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&util_outputs,1,&utilCommandName,(allocator_type *)&ccg);
  cmdLists[0] = cmGeneratorTarget::GetPreBuildCommands
                          ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget);
  cmdLists[1] = cmGeneratorTarget::GetPostBuildCommands
                          ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget);
  local_2b0 = 0;
  lVar11 = 0;
  while (lVar11 != 2) {
    pcVar1 = (cmdLists[lVar11]->
             super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_f0 = lVar11;
    for (cc_00 = (cmdLists[lVar11]->
                 super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
                 super__Vector_impl_data._M_start; cc_00 != pcVar1; cc_00 = cc_00 + 1) {
      psVar8 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      std::__cxx11::string::string((string *)&local_50,(string *)psVar8);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&ccg,cc_00,&local_50,
                 (cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
      std::__cxx11::string::~string((string *)&local_50);
      cmLocalNinjaGenerator::AppendCustomCommandDeps
                ((this->super_cmNinjaTargetGenerator).LocalGenerator,&ccg,&deps);
      cmLocalNinjaGenerator::AppendCustomCommandLines
                ((this->super_cmNinjaTargetGenerator).LocalGenerator,&ccg,&commands);
      pvVar9 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
      _Var2._M_current =
           (pvVar9->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var3._M_current =
           (pvVar9->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar10.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var2,_Var3,&util_outputs,MVar10);
      bVar6 = cmCustomCommand::GetUsesTerminal(cc_00);
      local_2b0 = CONCAT71((int7)((ulong)local_2b0 >> 8),(byte)local_2b0 | bVar6);
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
    }
    lVar11 = local_f0 + 1;
  }
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ccg,"CMAKE_BUILD_TYPE",(allocator<char> *)&command);
  psVar8 = cmMakefile::GetSafeDefinition(this_00,(string *)&ccg);
  std::__cxx11::string::string((string *)&config,(string *)psVar8);
  std::__cxx11::string::~string((string *)&ccg);
  cmGeneratorTarget::GetSourceFiles
            ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &sources,&config);
  ppcVar5 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar16 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar16 != ppcVar5;
      ppcVar16 = ppcVar16 + 1) {
    cc = cmSourceFile::GetCustomCommand(*ppcVar16);
    if (cc != (cmCustomCommand *)0x0) {
      psVar8 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      std::__cxx11::string::string((string *)&local_70,(string *)psVar8);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&ccg,cc,&local_70,
                 (cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
      std::__cxx11::string::~string((string *)&local_70);
      cmLocalNinjaGenerator::AddCustomCommandTarget
                ((this->super_cmNinjaTargetGenerator).LocalGenerator,cc,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget)
      ;
      pvVar9 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(&ccg);
      pvVar12 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
      _Var2._M_current =
           (pvVar9->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var3._M_current =
           (pvVar9->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar10.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var2,_Var3,&deps,MVar10);
      _Var2._M_current =
           (pvVar12->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var3._M_current =
           (pvVar12->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar10.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var2,_Var3,&deps,MVar10);
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
    }
  }
  cmLocalNinjaGenerator::AppendTargetOutputs
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &outputs);
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &deps,DependOnTargetArtifact);
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar15 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&desc,&this->super_cmNinjaTargetGenerator);
    std::operator+(&command,"Utility command for ",&desc);
    local_2a8.field_2._M_allocated_capacity = 0;
    local_228.field_2._M_allocated_capacity = 0;
    local_2a8._M_dataplus._M_p = (pointer)0x0;
    local_2a8._M_string_length = 0;
    local_228._M_dataplus._M_p = (pointer)0x0;
    local_228._M_string_length = 0;
    ccg.Config.field_2._M_allocated_capacity = (size_type)&ccg.Config;
    ccg.CC = (cmCustomCommand *)0x0;
    ccg.Config._M_dataplus._M_p = (pointer)0x0;
    ccg.Config._M_string_length = 0;
    ccg.LG = (cmLocalGenerator *)0x0;
    ccg.Config.field_2._8_8_ = ccg.Config.field_2._M_allocated_capacity;
    cmGlobalNinjaGenerator::WritePhonyBuild
              (pcVar14,(ostream *)pcVar15,&command,&outputs,&deps,(cmNinjaDeps *)&local_2a8,
               (cmNinjaDeps *)&local_228,(cmNinjaVars *)&ccg);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&ccg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_228);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2a8);
    std::__cxx11::string::~string((string *)&command);
    std::__cxx11::string::~string((string *)&desc);
LAB_00257f5c:
    TVar7 = cmGeneratorTarget::GetType
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (TVar7 == GLOBAL_TARGET) goto LAB_00257fa6;
    pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
              ((string *)&ccg,&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddTargetAlias
              (pcVar14,(string *)&ccg,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
    this_02 = &ccg;
  }
  else {
    pcVar4 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ccg,"utility",(allocator<char> *)&desc);
    cmLocalNinjaGenerator::BuildCommandLine
              (&command,pcVar4,&commands,(string *)&ccg,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
    std::__cxx11::string::~string((string *)&ccg);
    this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ccg,"EchoString",(allocator<char> *)&desc);
    pcVar13 = cmGeneratorTarget::GetProperty(this_01,(string *)&ccg);
    std::__cxx11::string::~string((string *)&ccg);
    desc._M_dataplus._M_p = (pointer)&desc.field_2;
    desc._M_string_length = 0;
    desc.field_2._M_local_buf[0] = '\0';
    if (pcVar13 == (char *)0x0) {
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_2a8,&this->super_cmNinjaTargetGenerator);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ccg,
                     "Running utility command for ",&local_2a8);
      std::__cxx11::string::operator=((string *)&desc,(string *)&ccg);
      std::__cxx11::string::~string((string *)&ccg);
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    else {
      std::__cxx11::string::assign((char *)&desc);
    }
    pcVar4 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar8 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar4);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&ccg,
               &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar8,SHELL);
    cmsys::SystemTools::ReplaceString(&command,"$(CMAKE_SOURCE_DIR)",(char *)ccg.CC);
    std::__cxx11::string::~string((string *)&ccg);
    pcVar4 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar8 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar4);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&ccg,
               &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar8,SHELL);
    cmsys::SystemTools::ReplaceString(&command,"$(CMAKE_BINARY_DIR)",(char *)ccg.CC);
    std::__cxx11::string::~string((string *)&ccg);
    cmsys::SystemTools::ReplaceString(&command,"$(ARGS)","");
    lVar11 = std::__cxx11::string::find((char)&command,0x24);
    if (lVar11 == -1) {
      for (; util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          util_outputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               util_outputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        cmGlobalNinjaGenerator::SeenCustomCommandOutput
                  (pcVar14,util_outputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_2a8,&this->super_cmNinjaTargetGenerator);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ccg,
                     "Utility command for ",&local_2a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"",(allocator<char> *)&local_a8);
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGlobalNinjaGenerator::WriteCustomCommandBuild
                (pcVar14,&command,&desc,(string *)&ccg,&local_228,(bool)((byte)local_2b0 & 1),true,
                 &util_outputs,&deps,&local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&ccg);
      std::__cxx11::string::~string((string *)&local_2a8);
      pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar15 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"",&local_2b1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_228,1,&utilCommandName,&local_2b2);
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ccg.Config.field_2._M_allocated_capacity = (size_type)&ccg.Config;
      ccg.CC = (cmCustomCommand *)0x0;
      ccg.Config._M_dataplus._M_p = (pointer)0x0;
      ccg.Config._M_string_length = 0;
      ccg.LG = (cmLocalGenerator *)0x0;
      ccg.Config.field_2._8_8_ = ccg.Config.field_2._M_allocated_capacity;
      cmGlobalNinjaGenerator::WritePhonyBuild
                (pcVar14,(ostream *)pcVar15,&local_2a8,&outputs,(cmNinjaDeps *)&local_228,&local_108
                 ,(cmNinjaDeps *)&local_a8,(cmNinjaVars *)&ccg);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&ccg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_228);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&command);
      goto LAB_00257f5c;
    }
    std::__cxx11::string::~string((string *)&desc);
    this_02 = (cmCustomCommandGenerator *)&command;
  }
  std::__cxx11::string::~string((string *)this_02);
LAB_00257fa6:
  std::__cxx11::string::~string((string *)&config);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&util_outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&deps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::__cxx11::string::~string((string *)&utilCommandName);
  return;
}

Assistant:

void cmNinjaUtilityTargetGenerator::Generate()
{
  std::string utilCommandName =
    this->GetLocalGenerator()->GetCurrentBinaryDirectory();
  utilCommandName += "/CMakeFiles";
  utilCommandName += "/";
  utilCommandName += this->GetTargetName() + ".util";
  utilCommandName = this->ConvertToNinjaPath(utilCommandName);

  std::vector<std::string> commands;
  cmNinjaDeps deps, outputs, util_outputs(1, utilCommandName);

  const std::vector<cmCustomCommand>* cmdLists[2] = {
    &this->GetGeneratorTarget()->GetPreBuildCommands(),
    &this->GetGeneratorTarget()->GetPostBuildCommands()
  };

  bool uses_terminal = false;

  for (unsigned i = 0; i != 2; ++i) {
    for (cmCustomCommand const& ci : *cmdLists[i]) {
      cmCustomCommandGenerator ccg(ci, this->GetConfigName(),
                                   this->GetLocalGenerator());
      this->GetLocalGenerator()->AppendCustomCommandDeps(ccg, deps);
      this->GetLocalGenerator()->AppendCustomCommandLines(ccg, commands);
      std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(util_outputs), MapToNinjaPath());
      if (ci.GetUsesTerminal()) {
        uses_terminal = true;
      }
    }
  }

  std::vector<cmSourceFile*> sources;
  std::string config =
    this->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");
  this->GetGeneratorTarget()->GetSourceFiles(sources, config);
  for (cmSourceFile const* source : sources) {
    if (cmCustomCommand const* cc = source->GetCustomCommand()) {
      cmCustomCommandGenerator ccg(*cc, this->GetConfigName(),
                                   this->GetLocalGenerator());
      this->GetLocalGenerator()->AddCustomCommandTarget(
        cc, this->GetGeneratorTarget());

      // Depend on all custom command outputs.
      const std::vector<std::string>& ccOutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccByproducts = ccg.GetByproducts();
      std::transform(ccOutputs.begin(), ccOutputs.end(),
                     std::back_inserter(deps), MapToNinjaPath());
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(deps), MapToNinjaPath());
    }
  }

  this->GetLocalGenerator()->AppendTargetOutputs(this->GetGeneratorTarget(),
                                                 outputs);
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 deps);

  if (commands.empty()) {
    this->GetGlobalGenerator()->WritePhonyBuild(
      this->GetBuildFileStream(),
      "Utility command for " + this->GetTargetName(), outputs, deps);
  } else {
    std::string command = this->GetLocalGenerator()->BuildCommandLine(
      commands, "utility", this->GeneratorTarget);
    const char* echoStr =
      this->GetGeneratorTarget()->GetProperty("EchoString");
    std::string desc;
    if (echoStr) {
      desc = echoStr;
    } else {
      desc = "Running utility command for " + this->GetTargetName();
    }

    // TODO: fix problematic global targets.  For now, search and replace the
    // makefile vars.
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_SOURCE_DIR)",
      this->GetLocalGenerator()
        ->ConvertToOutputFormat(
          this->GetLocalGenerator()->GetSourceDirectory(),
          cmOutputConverter::SHELL)
        .c_str());
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_BINARY_DIR)",
      this->GetLocalGenerator()
        ->ConvertToOutputFormat(
          this->GetLocalGenerator()->GetBinaryDirectory(),
          cmOutputConverter::SHELL)
        .c_str());
    cmSystemTools::ReplaceString(command, "$(ARGS)", "");

    if (command.find('$') != std::string::npos) {
      return;
    }

    for (std::string const& util_output : util_outputs) {
      this->GetGlobalGenerator()->SeenCustomCommandOutput(util_output);
    }

    this->GetGlobalGenerator()->WriteCustomCommandBuild(
      command, desc, "Utility command for " + this->GetTargetName(),
      /*depfile*/ "", uses_terminal,
      /*restat*/ true, util_outputs, deps);

    this->GetGlobalGenerator()->WritePhonyBuild(
      this->GetBuildFileStream(), "", outputs,
      cmNinjaDeps(1, utilCommandName));
  }

  // Add an alias for the logical target name regardless of what directory
  // contains it.  Skip this for GLOBAL_TARGET because they are meant to
  // be per-directory and have one at the top-level anyway.
  if (this->GetGeneratorTarget()->GetType() != cmStateEnums::GLOBAL_TARGET) {
    this->GetGlobalGenerator()->AddTargetAlias(this->GetTargetName(),
                                               this->GetGeneratorTarget());
  }
}